

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O2

int __thiscall InvertDatabase::make_l1_pass(InvertDatabase *this)

{
  int *piVar1;
  int *piVar2;
  Env *this_00;
  pointer piVar3;
  Partition *this_01;
  int supsz;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  vint *this_02;
  element_type *peVar8;
  InvertDatabase *this_03;
  long lVar9;
  int iVar10;
  int ivalsz;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> ival;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  this_00 = this->env;
  this_02 = &this->backidx;
  std::vector<int,_std::allocator<int>_>::resize(this_02,100);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->fidx,
             (long)((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->dbase_max_item);
  this->numfreq = 0;
  ivalsz = 100;
  std::make_shared<std::vector<int,std::allocator<int>>,int&>((int *)&ival);
  iVar10 = 100;
  lVar9 = 0;
  do {
    if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        dbase_max_item <= lVar9) {
      std::vector<int,_std::allocator<int>_>::resize(this_02,(long)this->numfreq);
      local_48._M_ptr = (element_type *)0x0;
      local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
      operator=(&ival.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ,&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      iVar10 = this->numfreq;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ival.
                  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return iVar10;
    }
    iVar5 = (int)lVar9;
    supsz = Partition::partition_get_idxsup
                      ((this->partition).super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,iVar5);
    if (ivalsz < supsz) {
      std::vector<int,_std::allocator<int>_>::resize
                (ival.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(long)supsz);
      ivalsz = supsz;
    }
    piVar3 = ((ival.
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    this_01 = (this->partition).super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> *
                 )(local_68 + 0x10),
                 &ival.
                  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                );
    Partition::partition_read_item
              (this_01,(shared_ptr<std::vector<int,_std::allocator<int>_>_> *)(local_68 + 0x10),
               iVar5);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    peVar8 = (this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar7 = 0;
    while( true ) {
      iVar4 = ClassInfo::get_num_class(peVar8);
      if (iVar4 <= lVar7) break;
      peVar8 = (this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (peVar8->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar7] = 0;
      lVar7 = lVar7 + 1;
    }
    iVar4 = -1;
    for (lVar7 = 0; lVar7 < supsz; lVar7 = lVar7 + 2) {
      if (iVar4 != piVar3[lVar7]) {
        ClassInfo::increase_tmpe
                  ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (int)lVar7);
        iVar4 = piVar3[lVar7];
      }
    }
    (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar9] = -1;
    peVar8 = (this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar7 = 0;
    do {
      iVar4 = ClassInfo::get_num_class(peVar8);
      if (iVar4 <= lVar7) goto LAB_00116d23;
      peVar8 = (this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      piVar1 = (peVar8->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + lVar7;
      piVar2 = (peVar8->min_supports).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + lVar7;
      lVar7 = lVar7 + 1;
    } while (*piVar1 < *piVar2);
    iVar4 = this->numfreq;
    if (iVar10 <= iVar4) {
      iVar10 = iVar10 * 2;
      std::vector<int,_std::allocator<int>_>::resize(this_02,(long)iVar10);
      iVar4 = this->numfreq;
    }
    (this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar4] = iVar5;
    iVar4 = this->numfreq;
    (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar9] = iVar4;
    this->numfreq = iVar4 + 1;
    lVar7 = 0;
    while( true ) {
      iVar4 = ClassInfo::get_num_class
                        ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      if (iVar4 <= lVar7) break;
      add_sup(this,(((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7],(int)lVar7);
      lVar7 = lVar7 + 1;
    }
    if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        outputfreq != '\0') {
      poVar6 = (ostream *)std::ostream::operator<<(this_00,iVar5);
      std::operator<<(poVar6," --");
      poVar6 = std::operator<<((ostream *)this_00," ");
      iVar5 = get_sup(this,iVar5,-1);
      std::ostream::operator<<(poVar6,iVar5);
      lVar7 = 0;
      while( true ) {
        iVar5 = ClassInfo::get_num_class
                          ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
        if (iVar5 <= lVar7) break;
        poVar6 = std::operator<<((ostream *)this_00," ");
        std::ostream::operator<<
                  (poVar6,(((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar7]);
        lVar7 = lVar7 + 1;
      }
      std::operator<<((ostream *)this_00," ");
      if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          print_tidlist != '\0') {
        this_03 = (InvertDatabase *)local_68;
        std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr((__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)local_68,
                     &ival.
                      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
        print_idlist(this_03,(ostream *)&this_00->idlstrm,
                     (shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_68,supsz);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
      }
      std::endl<char,std::char_traits<char>>((ostream *)this_00);
    }
LAB_00116d23:
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

int InvertDatabase::make_l1_pass() {
    int i, j;
    int supsz;
    int bsz = 100;

    ostringstream &seqstrm = env.seqstrm;
    ostringstream &idlstrm = env.idlstrm;

    backidx.resize(bsz);
    fidx.resize(args->dbase_max_item);

    numfreq = 0;
    int ivalsz = 100;
    shared_ptr<vint> ival = make_shared<vint>(ivalsz);
//   int tt=0;
    for (i = 0; i < args->dbase_max_item; i++) {
        supsz = partition->partition_get_idxsup(i);
        if (ivalsz < supsz) {
            ivalsz = supsz;
            ival->resize(ivalsz);
        }
        int *ival_data = ival->data();
        partition->partition_read_item(ival, i);
        for (j = 0; j < cls->get_num_class(); j++) {
            cls->set_tmpe_item(j, 0);
        }

        int cid = -1;
        for (j = 0; j < supsz; j += 2) {
            if (cid != ival_data[j]) {
                cls->increase_tmpe(j);
            }
            cid = ival_data[j];
        }

        char lflg = 0;
        fidx[i] = -1;       // default init
        for (j = 0; j < cls->get_num_class(); j++) {
            if (cls->strong_esupport(j)) {
                lflg = 1;
                if (numfreq + 1 > bsz) {
                    bsz = 2 * bsz;
                    backidx.resize(bsz);
                }
                backidx[numfreq] = i;
                fidx[i] = numfreq;
                //   cls->TMPE[j] << endl;
                numfreq++;
                break;
            }
        }

        if (lflg) {
            for (j = 0; j < cls->get_num_class(); j++)
                add_sup(cls->get_tmpe_item(j), j);
            if (args->outputfreq) {
                seqstrm << i << " --";
                seqstrm << " " << get_sup(i);
                for (j = 0; j < cls->get_num_class(); j++)
                    seqstrm << " " << cls->get_tmpe_item(j);
                seqstrm << " ";
                if (args->print_tidlist) print_idlist(idlstrm, ival, supsz);
                seqstrm << endl;
            }
        }
    }

    backidx.resize(numfreq);
    ival = nullptr;

    return numfreq;
}